

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

OPJ_UINT32 opj_j2k_get_max_coc_size(opj_j2k_t *p_j2k)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  uint uVar3;
  OPJ_UINT32 OVar4;
  OPJ_UINT32 p_tile_no;
  OPJ_UINT32 p_comp_no;
  
  OVar4 = (p_j2k->m_cp).th * (p_j2k->m_cp).tw;
  if (OVar4 == 0) {
    OVar4 = 6;
  }
  else {
    OVar1 = p_j2k->m_private_image->numcomps;
    uVar3 = 0;
    p_tile_no = 0;
    do {
      if (OVar1 != 0) {
        p_comp_no = 0;
        do {
          OVar2 = opj_j2k_get_SPCod_SPCoc_size(p_j2k,p_tile_no,p_comp_no);
          if (uVar3 <= OVar2) {
            uVar3 = OVar2;
          }
          p_comp_no = p_comp_no + 1;
        } while (OVar1 != p_comp_no);
      }
      p_tile_no = p_tile_no + 1;
    } while (p_tile_no != OVar4);
    OVar4 = uVar3 + 6;
  }
  return OVar4;
}

Assistant:

static OPJ_UINT32 opj_j2k_get_max_coc_size(opj_j2k_t *p_j2k)
{
    OPJ_UINT32 i, j;
    OPJ_UINT32 l_nb_comp;
    OPJ_UINT32 l_nb_tiles;
    OPJ_UINT32 l_max = 0;

    /* preconditions */

    l_nb_tiles = p_j2k->m_cp.tw * p_j2k->m_cp.th ;
    l_nb_comp = p_j2k->m_private_image->numcomps;

    for (i = 0; i < l_nb_tiles; ++i) {
        for (j = 0; j < l_nb_comp; ++j) {
            l_max = opj_uint_max(l_max, opj_j2k_get_SPCod_SPCoc_size(p_j2k, i, j));
        }
    }

    return 6 + l_max;
}